

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

bool Debug::getSourceLine(void *addr,String *file,int *line)

{
  usize *puVar1;
  ulong uVar2;
  Data *pDVar3;
  long lVar4;
  int iVar5;
  undefined8 *__ptr;
  char *pcVar6;
  char *start_1;
  Map<String,_String> *__nbytes;
  Data *pDVar7;
  usize uVar8;
  ulong length;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  Process process;
  void *relAddr;
  String addrStr;
  String cmd;
  String bin;
  String buf;
  void *addrs [1];
  Process local_1a0;
  String local_190;
  undefined8 local_168;
  String local_160;
  String local_138;
  String local_110;
  Map<String,_String> local_e8;
  void *local_30;
  
  local_30 = addr;
  __ptr = (undefined8 *)backtrace_symbols(&local_30,1);
  if (__ptr != (undefined8 *)0x0) {
    pcVar9 = (char *)*__ptr;
    if (pcVar9 != (char *)0x0) {
      uVar8 = 0xffffffffffffffff;
      do {
        lVar4 = uVar8 + 1;
        uVar8 = uVar8 + 1;
      } while (pcVar9[lVar4] != '\0');
      String::String(&local_160,pcVar9,uVar8);
      free(__ptr);
      pcVar6 = (local_160.data)->str;
      uVar8 = (local_160.data)->len;
      pcVar9 = pcVar6 + uVar8;
      do {
        pcVar9 = pcVar9 + -1;
        pcVar11 = (char *)0x0;
        if (pcVar9 < pcVar6) break;
        pcVar11 = pcVar9;
      } while (*pcVar9 != '[');
      pcVar9 = pcVar6 + uVar8;
      pcVar10 = pcVar6 + ~(ulong)pcVar11 + uVar8;
      do {
        pcVar9 = pcVar9 + -1;
        if (pcVar9 < pcVar6) goto LAB_00102fc7;
        pcVar10 = pcVar10 + -1;
      } while (*pcVar9 != ']');
      bVar13 = false;
      if ((pcVar11 != (char *)0x0) && (bVar13 = false, pcVar11 <= pcVar9)) {
        pcVar9 = String::operator_cast_to_char_(&local_160);
        String::substr((String *)&local_e8,&local_160,(ssize)(pcVar11 + (1 - (long)pcVar9)),
                       (ssize)pcVar10);
        iVar5 = String::scanf((String *)&local_e8,"%p",&local_168);
        if (((local_e8._end.item)->key)._data.capacity != 0) {
          LOCK();
          puVar1 = &((local_e8._end.item)->key)._data.capacity;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_e8._end.item != (Item *)0x0)) {
            operator_delete__(local_e8._end.item);
          }
        }
        if (iVar5 == 1) {
          pcVar6 = (local_160.data)->str;
          pcVar9 = pcVar6 + (local_160.data)->len;
          pcVar11 = pcVar6 + (local_160.data)->len;
          do {
            pcVar9 = pcVar9 + -1;
            if (pcVar9 < pcVar6) goto LAB_00102fc7;
            pcVar11 = pcVar11 + -1;
          } while (*pcVar9 != '(');
          pcVar9 = String::operator_cast_to_char_(&local_160);
          uVar12 = (long)pcVar11 - (long)pcVar9;
          uVar2 = (local_160.data)->len;
          length = uVar2;
          if (uVar12 < uVar2) {
            length = uVar12;
          }
          if ((long)uVar12 < 0) {
            length = uVar2;
          }
          String::String(&local_110,(local_160.data)->str,length);
          pcVar9 = String::operator_cast_to_char_(&local_110);
          String::fromPrintf(&local_138,"addr2line -e \"%s\" %p",pcVar9,local_168);
          Process::Process(&local_1a0);
          local_e8._end.item = &local_e8.endItem;
          local_e8.root = (Item *)0x0;
          local_e8._size = 0;
          local_e8.endItem.key.data = &String::emptyData.super_Data;
          local_e8.endItem.value.data = &String::emptyData.super_Data;
          local_e8.endItem.parent = (Item *)0x0;
          local_e8.endItem.next = (Item *)0x0;
          local_e8.endItem.prev = (Item *)0x0;
          local_e8.freeItem = (Item *)0x0;
          local_e8.blocks = (ItemBlock *)0x0;
          __nbytes = &local_e8;
          local_e8._begin.item = local_e8._end.item;
          iVar5 = Process::open(&local_1a0,(char *)&local_138,1);
          Map<String,_String>::~Map(&local_e8);
          if ((char)iVar5 == '\0') {
            bVar13 = false;
          }
          else {
            local_e8._end.item = (Item *)&String::emptyData;
            uVar8 = 0x8000;
            if (0x8000 < String::emptyData.super_Data.len) {
              uVar8 = String::emptyData.super_Data.len;
            }
            String::detach((String *)&local_e8,String::emptyData.super_Data.len,uVar8);
            pcVar9 = ((local_e8._end.item)->key)._data.str;
            String::detach((String *)&local_e8,(usize)pcVar9,(usize)pcVar9);
            uVar8 = Process::read(&local_1a0,(int)((local_e8._end.item)->key).data,(void *)0x8000,
                                  (size_t)__nbytes);
            if ((long)uVar8 < 0) {
LAB_00103008:
              bVar13 = false;
            }
            else {
              String::detach((String *)&local_e8,uVar8,uVar8);
              pDVar3 = ((local_e8._end.item)->key).data;
              pcVar9 = ((local_e8._end.item)->key)._data.str;
              pDVar7 = (Data *)(pcVar9 + (long)&pDVar3->str);
              pcVar9 = pcVar9 + (long)&pDVar3->str;
              do {
                pDVar7 = (Data *)((long)&pDVar7[-1].ref + 7);
                if (pDVar7 < pDVar3) goto LAB_00103008;
                pcVar9 = pcVar9 + -1;
              } while (*(char *)&pDVar7->str != ':');
              pcVar6 = String::operator_cast_to_char_((String *)&local_e8);
              pcVar10 = pcVar9 + -(long)pcVar6;
              pcVar6 = ((local_e8._end.item)->key)._data.str;
              pcVar11 = pcVar6;
              if (pcVar10 < pcVar6) {
                pcVar11 = pcVar10;
              }
              if ((long)pcVar10 < 0) {
                pcVar11 = pcVar6;
              }
              String::String(&local_190,(char *)((local_e8._end.item)->key).data,(usize)pcVar11);
              String::operator=(file,&local_190);
              if ((local_190.data)->ref != 0) {
                LOCK();
                puVar1 = &(local_190.data)->ref;
                *puVar1 = *puVar1 - 1;
                UNLOCK();
                if ((*puVar1 == 0) && (local_190.data != (Data *)0x0)) {
                  operator_delete__(local_190.data);
                }
              }
              pcVar6 = String::operator_cast_to_char_((String *)&local_e8);
              String::substr(&local_190,(String *)&local_e8,(ssize)(pcVar9 + (1 - (long)pcVar6)),-1)
              ;
              iVar5 = String::scanf(&local_190,"%d",line);
              bVar13 = iVar5 == 1;
              if ((local_190.data)->ref != 0) {
                LOCK();
                puVar1 = &(local_190.data)->ref;
                *puVar1 = *puVar1 - 1;
                UNLOCK();
                if ((*puVar1 == 0) && (local_190.data != (Data *)0x0)) {
                  operator_delete__(local_190.data);
                }
              }
            }
            if (((local_e8._end.item)->key)._data.capacity != 0) {
              LOCK();
              puVar1 = &((local_e8._end.item)->key)._data.capacity;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_e8._end.item != (Item *)0x0)) {
                operator_delete__(local_e8._end.item);
              }
            }
          }
          Process::~Process(&local_1a0);
          if ((local_138.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_138.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_138.data != (Data *)0x0)) {
              operator_delete__(local_138.data);
            }
          }
          if ((local_110.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_110.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_110.data != (Data *)0x0)) {
              operator_delete__(local_110.data);
            }
          }
        }
        else {
LAB_00102fc7:
          bVar13 = false;
        }
      }
      if ((local_160.data)->ref == 0) {
        return bVar13;
      }
      LOCK();
      puVar1 = &(local_160.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if (*puVar1 != 0) {
        return bVar13;
      }
      if (local_160.data == (Data *)0x0) {
        return bVar13;
      }
      operator_delete__(local_160.data);
      return bVar13;
    }
    free(__ptr);
  }
  return false;
}

Assistant:

bool Debug::getSourceLine(void* addr, String& file, int& line)
{
#ifdef _WIN32
  typedef BOOL (WINAPI *PSymInitialize)(HANDLE hProcess, PCSTR UserSearchPath, BOOL fInvadeProcess);
  typedef BOOL (WINAPI *PSymGetLineFromAddr64)(HANDLE hProcess, DWORD64 qwAddr, PDWORD pdwDisplacement, PIMAGEHLP_LINE64 Line64);
  static PSymInitialize pSymInitialize = 0;
  static PSymGetLineFromAddr64 pSymGetLineFromAddr64 = 0;
  static bool initialized = false;
  HANDLE hProcess = GetCurrentProcess();
  if(!initialized)
  {
    initialized = true;
    HMODULE hModule = LoadLibrary("Dbghelp.dll");
    if(!hModule)
      return false;
    pSymInitialize = (PSymInitialize)GetProcAddress(hModule, "SymInitialize");
    pSymGetLineFromAddr64 = (PSymGetLineFromAddr64)GetProcAddress(hModule, "SymGetLineFromAddr64");
    if(!pSymInitialize || !pSymGetLineFromAddr64)
      return false;
    if(!pSymInitialize(hProcess, NULL, TRUE))
    {
      pSymGetLineFromAddr64 = 0;
      return false;
    }
  }
  if(!pSymGetLineFromAddr64)
    return false;
  IMAGEHLP_LINE64 ihLine;
  ihLine.SizeOfStruct = sizeof(IMAGEHLP_LINE64);
  DWORD displacement;
  if(!pSymGetLineFromAddr64(hProcess, (DWORD64)addr, &displacement, &ihLine))
    return false;
#ifdef UNICODE
  static wchar_t fileName[MAX_PATH];
  size_t len = mbstowcs(fileName, ihLine.FileName, strlen(ihLine.FileName));
  if(len == -1)
      return false;
  file = String(fileName, len);
#else
  file = String::fromCString(ihLine.FileName);
#endif
  line = ihLine.LineNumber;
  return true;
#else
  void* addrs[1];
  addrs[0] = addr;
  char** addrStrs = backtrace_symbols(addrs, 1);
  if(!addrStrs)
      return false;
  if(!*addrStrs)
  {
      free(addrStrs);
      return false;
  }
  String addrStr = String::fromCString(*addrStrs);
  free(addrStrs);
  const char* addrStart = addrStr.findLast('[');
  const char* addrEnd = addrStr.findLast(']');
  if(!addrStart ||!addrEnd || addrEnd < addrStart)
      return false;
  ++addrStart;
  void* relAddr;
  if(addrStr.substr(addrStart - (const char*)addrStr, addrEnd - addrStart).scanf("%p", &relAddr) != 1)
      return false;
  const char* binaryEnd = addrStr.findLast('(');
  if(!binaryEnd)
      return false;
  String bin = addrStr.substr(0, binaryEnd - (const char*)addrStr);
  String cmd = String::fromPrintf("addr2line -e \"%s\" %p", (const char*)bin, relAddr);
  Process process;
  if(!process.open(cmd))
      return false;
  String buf;
  buf.reserve(1024 * 32);
  ssize i = process.read((char*)buf, 1024 * 32);
  if(i < 0)
    return false;
  buf.resize(i);
  const char* fileEnd = buf.findLast(':');
  if(!fileEnd)
      return false;
  file = buf.substr(0, fileEnd - (const char*)buf);
  if(buf.substr(fileEnd - (const char*)buf + 1).scanf("%d", &line) != 1)
      return false;
  return true;
#endif
}